

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.cpp
# Opt level: O3

RefAST antlr::CommonAST::factory(void)

{
  AST *pAVar1;
  ASTRef *in_RDI;
  
  pAVar1 = (AST *)operator_new(0x48);
  pAVar1->ref = (ASTRef *)0x0;
  pAVar1[1]._vptr_AST = (_func_int **)0x0;
  pAVar1[1].ref = (ASTRef *)0x0;
  pAVar1->_vptr_AST = (_func_int **)&PTR__CommonAST_002f7328;
  *(undefined4 *)&pAVar1[2]._vptr_AST = 0;
  pAVar1[2].ref = (ASTRef *)&pAVar1[3].ref;
  pAVar1[3]._vptr_AST = (_func_int **)0x0;
  *(undefined1 *)&pAVar1[3].ref = 0;
  pAVar1 = (AST *)ASTRef::getRef(pAVar1);
  in_RDI->ptr = pAVar1;
  return (RefAST)in_RDI;
}

Assistant:

RefAST CommonAST::factory()
{
	return RefAST(new CommonAST);
}